

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this)

{
  Descriptor *this_00;
  DynamicMessage *this_01;
  DynamicMessageFactory *this_02;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  int32 iVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  InternalMetadataWithArena *this_03;
  ExtensionSet *this_04;
  FieldDescriptor *this_05;
  uint *puVar7;
  DynamicMapField *this_06;
  OneofDescriptor *pOVar8;
  EnumValueDescriptor *this_07;
  FieldOptions *this_08;
  ArenaStringPtr *this_09;
  Descriptor *type;
  Message *default_entry;
  float fVar9;
  _func_int **pp_Var10;
  ArenaStringPtr *asp;
  string *default_value;
  void *field_ptr;
  FieldDescriptor *field;
  int i_1;
  int i;
  Descriptor *descriptor;
  DynamicMessage *this_local;
  
  this_00 = this->type_info_->type;
  for (field._4_4_ = 0; iVar2 = Descriptor::oneof_decl_count(this_00), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    puVar6 = (undefined4 *)
             OffsetToPointer(this,this->type_info_->oneof_case_offset + field._4_4_ * 4);
    *puVar6 = 0;
  }
  this_03 = (InternalMetadataWithArena *)
            OffsetToPointer(this,this->type_info_->internal_metadata_offset);
  internal::InternalMetadataWithArena::InternalMetadataWithArena(this_03);
  if (this->type_info_->extensions_offset != -1) {
    this_04 = (ExtensionSet *)OffsetToPointer(this,this->type_info_->extensions_offset);
    internal::ExtensionSet::ExtensionSet(this_04);
  }
  for (field._0_4_ = 0; iVar2 = Descriptor::field_count(this_00), (int)field < iVar2;
      field._0_4_ = (int)field + 1) {
    this_05 = Descriptor::field(this_00,(int)field);
    puVar7 = internal::scoped_array<unsigned_int>::operator[]
                       (&this->type_info_->offsets,(long)(int)field);
    this_06 = (DynamicMapField *)OffsetToPointer(this,*puVar7);
    pOVar8 = FieldDescriptor::containing_oneof(this_05);
    if (pOVar8 == (OneofDescriptor *)0x0) {
      CVar3 = FieldDescriptor::cpp_type(this_05);
      switch(CVar3) {
      case CPPTYPE_INT32:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_06);
        }
        else {
          iVar4 = FieldDescriptor::default_value_int32(this_05);
          *(int32 *)&(this_06->
                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                     ).super_MapFieldBase._vptr_MapFieldBase = iVar4;
        }
        break;
      case CPPTYPE_INT64:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<long>::RepeatedField((RepeatedField<long> *)this_06);
        }
        else {
          pp_Var10 = (_func_int **)FieldDescriptor::default_value_int64(this_05);
          (this_06->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var10;
        }
        break;
      case CPPTYPE_UINT32:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)this_06);
        }
        else {
          uVar5 = FieldDescriptor::default_value_uint32(this_05);
          *(uint32 *)
           &(this_06->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = uVar5;
        }
        break;
      case CPPTYPE_UINT64:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)this_06);
        }
        else {
          pp_Var10 = (_func_int **)FieldDescriptor::default_value_uint64(this_05);
          (this_06->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var10;
        }
        break;
      case CPPTYPE_DOUBLE:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<double>::RepeatedField((RepeatedField<double> *)this_06);
        }
        else {
          pp_Var10 = (_func_int **)FieldDescriptor::default_value_double(this_05);
          (this_06->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var10;
        }
        break;
      case CPPTYPE_FLOAT:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<float>::RepeatedField((RepeatedField<float> *)this_06);
        }
        else {
          fVar9 = FieldDescriptor::default_value_float(this_05);
          *(float *)&(this_06->
                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                     ).super_MapFieldBase._vptr_MapFieldBase = fVar9;
        }
        break;
      case CPPTYPE_BOOL:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)this_06);
        }
        else {
          bVar1 = FieldDescriptor::default_value_bool(this_05);
          *(bool *)&(this_06->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase._vptr_MapFieldBase = bVar1;
        }
        break;
      case CPPTYPE_ENUM:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_06);
        }
        else {
          this_07 = FieldDescriptor::default_value_enum(this_05);
          iVar2 = EnumValueDescriptor::number(this_07);
          *(int *)&(this_06->
                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                   ).super_MapFieldBase._vptr_MapFieldBase = iVar2;
        }
        break;
      case CPPTYPE_STRING:
        this_08 = FieldDescriptor::options(this_05);
        FieldOptions::ctype(this_08);
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)this_06);
        }
        else {
          bVar1 = is_prototype(this);
          if (bVar1) {
            asp = (ArenaStringPtr *)FieldDescriptor::default_value_string_abi_cxx11_(this_05);
          }
          else {
            this_01 = this->type_info_->prototype;
            puVar7 = internal::scoped_array<unsigned_int>::operator[]
                               (&this->type_info_->offsets,(long)(int)field);
            this_09 = (ArenaStringPtr *)OffsetToPointer(this_01,*puVar7);
            asp = (ArenaStringPtr *)internal::ArenaStringPtr::Get_abi_cxx11_(this_09);
          }
          memset(this_06,0,8);
          internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)this_06,(string *)asp);
        }
        break;
      case CPPTYPE_MESSAGE:
        bVar1 = FieldDescriptor::is_repeated(this_05);
        if (bVar1) {
          bVar1 = anon_unknown_0::IsMapFieldInApi(this_05);
          if (bVar1) {
            this_02 = this->type_info_->factory;
            type = FieldDescriptor::message_type(this_05);
            default_entry = DynamicMessageFactory::GetPrototypeNoLock(this_02,type);
            internal::DynamicMapField::DynamicMapField(this_06,default_entry);
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_06);
          }
        }
        else {
          (this_06->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicMessage::SharedCtor() {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->type;
  // Initialize oneof cases.
  for (int i = 0 ; i < descriptor->oneof_decl_count(); ++i) {
    new (OffsetToPointer(type_info_->oneof_case_offset + sizeof(uint32) * i))
        uint32(0);
  }

  new (OffsetToPointer(type_info_->internal_metadata_offset))
      InternalMetadataWithArena;

  if (type_info_->extensions_offset != -1) {
    new (OffsetToPointer(type_info_->extensions_offset)) ExtensionSet;
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);
    if (field->containing_oneof()) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                           \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
        if (!field->is_repeated()) {                                         \
          new(field_ptr) TYPE(field->default_value_##TYPE());                \
        } else {                                                             \
          new(field_ptr) RepeatedField<TYPE>();                              \
        }                                                                    \
        break;

      HANDLE_TYPE(INT32 , int32 );
      HANDLE_TYPE(INT64 , int64 );
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT , float );
      HANDLE_TYPE(BOOL  , bool  );
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new(field_ptr) int(field->default_value_enum()->number());
        } else {
          new(field_ptr) RepeatedField<int>();
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            if (!field->is_repeated()) {
              const string* default_value;
              if (is_prototype()) {
                default_value = &field->default_value_string();
              } else {
                default_value = &(reinterpret_cast<const ArenaStringPtr*>(
                                      type_info_->prototype->OffsetToPointer(
                                          type_info_->offsets[i]))
                                      ->Get());
              }
              ArenaStringPtr* asp = new(field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(default_value);
            } else {
              new(field_ptr) RepeatedPtrField<string>();
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new(field_ptr) Message*(NULL);
        } else {
          if (IsMapFieldInApi(field)) {
            new (field_ptr) DynamicMapField(
                type_info_->factory->GetPrototypeNoLock(field->message_type()));
          } else {
            new (field_ptr) RepeatedPtrField<Message>();
          }
        }
        break;
      }
    }
  }
}